

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::DictionaryFeatureType::clear_KeyType(DictionaryFeatureType *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  Int64FeatureType *this_00;
  
  if (this->_oneof_case_[0] == 2) {
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_0019e7af;
    this_00 = (Int64FeatureType *)(this->KeyType_).stringkeytype_;
    if (this_00 != (Int64FeatureType *)0x0) {
      StringFeatureType::~StringFeatureType((StringFeatureType *)this_00);
    }
  }
  else {
    if (this->_oneof_case_[0] != 1) goto LAB_0019e7af;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar2 = (undefined8 *)*puVar2;
    }
    if (puVar2 != (undefined8 *)0x0) goto LAB_0019e7af;
    this_00 = (this->KeyType_).int64keytype_;
    if (this_00 != (Int64FeatureType *)0x0) {
      Int64FeatureType::~Int64FeatureType(this_00);
    }
  }
  operator_delete(this_00,0x18);
LAB_0019e7af:
  this->_oneof_case_[0] = 0;
  return;
}

Assistant:

void DictionaryFeatureType::clear_KeyType() {
// @@protoc_insertion_point(one_of_clear_start:CoreML.Specification.DictionaryFeatureType)
  switch (KeyType_case()) {
    case kInt64KeyType: {
      if (GetArenaForAllocation() == nullptr) {
        delete KeyType_.int64keytype_;
      }
      break;
    }
    case kStringKeyType: {
      if (GetArenaForAllocation() == nullptr) {
        delete KeyType_.stringkeytype_;
      }
      break;
    }
    case KEYTYPE_NOT_SET: {
      break;
    }
  }
  _oneof_case_[0] = KEYTYPE_NOT_SET;
}